

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MieInteractionType.hpp
# Opt level: O0

void __thiscall
OpenMD::MieInteractionType::MieInteractionType
          (MieInteractionType *this,RealType mySigma,RealType myEpsilon,int myNrep,int myMatt)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  NonBondedInteractionType *in_RDI;
  _func_int **in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  NonBondedInteractionType *in_stack_ffffffffffffffd0;
  
  NonBondedInteractionType::NonBondedInteractionType(in_stack_ffffffffffffffd0);
  in_RDI->_vptr_NonBondedInteractionType = (_func_int **)&PTR__MieInteractionType_0046a2a0;
  in_RDI[1]._vptr_NonBondedInteractionType = in_XMM0_Qa;
  in_RDI[1].nbitp.is_LennardJones = (bool)(char)in_XMM1_Qa;
  in_RDI[1].nbitp.is_Morse = (bool)(char)((ulong)in_XMM1_Qa >> 8);
  in_RDI[1].nbitp.is_MAW = (bool)(char)((ulong)in_XMM1_Qa >> 0x10);
  in_RDI[1].nbitp.is_EAMTable = (bool)(char)((ulong)in_XMM1_Qa >> 0x18);
  in_RDI[1].nbitp.is_EAMZhou = (bool)(char)((ulong)in_XMM1_Qa >> 0x20);
  in_RDI[1].nbitp.is_EAMOxides = (bool)(char)((ulong)in_XMM1_Qa >> 0x28);
  in_RDI[1].nbitp.is_SC = (bool)(char)((ulong)in_XMM1_Qa >> 0x30);
  in_RDI[1].nbitp.is_RepulsivePower = (bool)(char)((ulong)in_XMM1_Qa >> 0x38);
  *(undefined4 *)&in_RDI[1].nbitp.is_Mie = in_ESI;
  *(undefined4 *)&in_RDI[1].field_0x14 = in_EDX;
  NonBondedInteractionType::setMie(in_RDI);
  return;
}

Assistant:

MieInteractionType(RealType mySigma, RealType myEpsilon, int myNrep,
                       int myMatt) {
      sigma   = mySigma;
      epsilon = myEpsilon;
      nRep    = myNrep;
      mAtt    = myMatt;
      setMie();
    }